

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fifteen.cpp
# Opt level: O0

void __thiscall Fifteen::createTiles(Fifteen *this)

{
  __tuple_element_t<0UL,_tuple<unsigned_long,_unsigned_long>_> *p_Var1;
  __tuple_element_t<1UL,_tuple<unsigned_long,_unsigned_long>_> *p_Var2;
  pointer this_00;
  type_conflict2 *tileSize;
  type_conflict2 *boardSize;
  unique_ptr<UndoMove,_std::default_delete<UndoMove>_> local_10;
  Fifteen *this_local;
  
  local_10._M_t.super___uniq_ptr_impl<UndoMove,_std::default_delete<UndoMove>_>._M_t.
  super__Tuple_impl<0UL,_UndoMove_*,_std::default_delete<UndoMove>_>.
  super__Head_base<0UL,_UndoMove_*,_false>._M_head_impl =
       (__uniq_ptr_data<UndoMove,_std::default_delete<UndoMove>,_true,_true>)
       (__uniq_ptr_data<UndoMove,_std::default_delete<UndoMove>,_true,_true>)this;
  std::unique_ptr<Controller,_std::default_delete<Controller>_>::operator->(&this->controller);
  Controller::getBoardAttributes((Controller *)&boardSize);
  p_Var1 = std::get<0ul,unsigned_long,unsigned_long>
                     ((tuple<unsigned_long,_unsigned_long> *)&boardSize);
  p_Var2 = std::get<1ul,unsigned_long,unsigned_long>
                     ((tuple<unsigned_long,_unsigned_long> *)&boardSize);
  this_00 = std::unique_ptr<TilesBoard,_std::default_delete<TilesBoard>_>::operator->
                      (&this->tilesBoard);
  TilesBoard::createTiles(this_00,*p_Var1,*p_Var2,&this->super_QMainWindow);
  return;
}

Assistant:

void Fifteen::createTiles()
{
    auto [ boardSize, tileSize ] = controller->getBoardAttributes();
    tilesBoard->createTiles( boardSize, tileSize, this );
}